

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString StringFrom(double value,int precision)

{
  int iVar1;
  ulong in_RSI;
  undefined4 in_register_0000003c;
  char *format;
  char *pcVar2;
  
  format = (char *)CONCAT44(in_register_0000003c,precision);
  iVar1 = (*PlatformSpecificIsNan)(value);
  if (iVar1 == 0) {
    iVar1 = (*PlatformSpecificIsInf)(value);
    if (iVar1 == 0) {
      StringFromFormat(format,value,"%.*g",in_RSI & 0xffffffff);
      return (SimpleString)format;
    }
    pcVar2 = "Inf - Infinity";
  }
  else {
    pcVar2 = "Nan - Not a number";
  }
  pcVar2 = SimpleString::copyToNewBuffer(pcVar2,0);
  *(char **)format = pcVar2;
  return (SimpleString)format;
}

Assistant:

SimpleString StringFrom(double value, int precision)
{
    if (PlatformSpecificIsNan(value))
        return "Nan - Not a number";
    else if (PlatformSpecificIsInf(value))
        return "Inf - Infinity";
    else
        return StringFromFormat("%.*g", precision, value);
}